

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iprog.c
# Opt level: O0

bool loot_prog_shelf(OBJ_DATA *shelf,OBJ_DATA *obj,CHAR_DATA *ch)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_RDI;
  bool found;
  int mobvnum;
  CHAR_DATA *mob;
  ROOM_INDEX_DATA *room;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint3 in_stack_ffffffffffffffc8;
  uint uVar4;
  int iVar5;
  char *format;
  bool local_1;
  
  uVar4 = (uint)in_stack_ffffffffffffffc8;
  lVar1 = *(long *)(in_RDI + 0x58);
  if (lVar1 == 0) {
    return true;
  }
  iVar3 = (int)*(short *)(*(long *)(in_RDI + 0x50) + 0x50);
  if (iVar3 == 0x8c1) {
    if (*(short *)(lVar1 + 0x13a) != 0x947) {
      return true;
    }
    iVar5 = 0x8ae;
  }
  else if (iVar3 == 0x8c2) {
    if (*(short *)(lVar1 + 0x13a) != 0x949) {
      return true;
    }
    iVar5 = 0x8ac;
  }
  else {
    if (iVar3 != 0x8c3) {
      return true;
    }
    if (*(short *)(lVar1 + 0x13a) != 0x94b) {
      return true;
    }
    iVar5 = 0x8ad;
  }
  format = *(char **)(lVar1 + 0x18);
  do {
    if (format == (char *)0x0) {
LAB_00665ba3:
      local_1 = (uVar4 & 0x1000000) != 0;
      if (local_1) {
        act(format,(CHAR_DATA *)CONCAT44(iVar5,uVar4),
            (void *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
        act(format,(CHAR_DATA *)CONCAT44(iVar5,uVar4),
            (void *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8,0);
      }
      local_1 = !local_1;
      return local_1;
    }
    bVar2 = is_npc(in_stack_ffffffffffffffb8);
    if ((bVar2) && (*(short *)(*(long *)(format + 0x78) + 0x48) == iVar5)) {
      uVar4 = CONCAT13(1,(int3)uVar4);
      goto LAB_00665ba3;
    }
    format = *(char **)(format + 8);
  } while( true );
}

Assistant:

bool loot_prog_shelf(OBJ_DATA *shelf, OBJ_DATA *obj, CHAR_DATA *ch)
{
	ROOM_INDEX_DATA *room;
	CHAR_DATA *mob;
	int mobvnum = 0;
	bool found= false;

	if ((room = shelf->in_room) == nullptr)
		return true;

	switch (shelf->pIndexData->vnum)
	{
		case 2241:
			if (room->vnum != 2375)
				return true;

			mobvnum = 2222;
			break;
		case 2242:
			if (room->vnum != 2377)
				return true;

			mobvnum = 2220;
			break;
		case 2243:
			if (room->vnum != 2379)
				return true;

			mobvnum = 2221;
			break;
		default:
			return true;
	}

	for (mob = room->people; mob; mob = mob->next_in_room)
	{
		if (!is_npc(mob))
			continue;

		if (mob->pIndexData->vnum == mobvnum)
		{
			found = true;
			break;
		}
	}

	if (!found)
		return true;

	act("$n bars your access to $p, and you are unable to do that.", mob, shelf, ch, TO_VICT);
	act("$N moves toward $p as though to get something from it, but $n blocks $m.", mob, shelf, ch, TO_NOTVICT);

	return false;
}